

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall spirv_cross::Compiler::flush_all_active_variables(Compiler *this)

{
  size_t sVar1;
  TypedID<(spirv_cross::Types)2> *pTVar2;
  Parameter *pPVar3;
  uint *puVar4;
  SPIRVariable *pSVar5;
  long lVar6;
  
  sVar1 = (this->current_function->local_variables).
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
  if (sVar1 != 0) {
    pTVar2 = (this->current_function->local_variables).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
    lVar6 = 0;
    do {
      pSVar5 = Variant::get<spirv_cross::SPIRVariable>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)((long)&pTVar2->id + lVar6));
      flush_dependees(this,pSVar5);
      lVar6 = lVar6 + 4;
    } while (sVar1 << 2 != lVar6);
  }
  sVar1 = (this->current_function->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>
          .buffer_size;
  if (sVar1 != 0) {
    pPVar3 = (this->current_function->arguments).
             super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
    lVar6 = 0;
    do {
      pSVar5 = Variant::get<spirv_cross::SPIRVariable>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)((long)&(pPVar3->id).id + lVar6));
      flush_dependees(this,pSVar5);
      lVar6 = lVar6 + 0x14;
    } while (sVar1 * 0x14 != lVar6);
  }
  sVar1 = (this->global_variables).super_VectorView<unsigned_int>.buffer_size;
  if (sVar1 != 0) {
    puVar4 = (this->global_variables).super_VectorView<unsigned_int>.ptr;
    lVar6 = 0;
    do {
      pSVar5 = Variant::get<spirv_cross::SPIRVariable>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)((long)puVar4 + lVar6));
      flush_dependees(this,pSVar5);
      lVar6 = lVar6 + 4;
    } while (sVar1 << 2 != lVar6);
  }
  flush_all_aliased_variables(this);
  return;
}

Assistant:

void Compiler::flush_all_active_variables()
{
	// Invalidate all temporaries we read from variables in this block since they were forwarded.
	// Invalidate all temporaries we read from globals.
	for (auto &v : current_function->local_variables)
		flush_dependees(get<SPIRVariable>(v));
	for (auto &arg : current_function->arguments)
		flush_dependees(get<SPIRVariable>(arg.id));
	for (auto global : global_variables)
		flush_dependees(get<SPIRVariable>(global));

	flush_all_aliased_variables();
}